

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::XmlUnitTestResultPrinter::OnTestIterationEnd
          (XmlUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  FilePath *this_00;
  FILE *__stream;
  bool bVar1;
  char *pcVar2;
  ostream *local_258;
  string local_220;
  stringstream local_200 [8];
  stringstream stream;
  ostream aoStack_1f0 [392];
  undefined1 local_68 [8];
  FilePath output_dir;
  FilePath output_file;
  FILE *xmlout;
  int param_2_local;
  UnitTest *unit_test_local;
  XmlUnitTestResultPrinter *this_local;
  
  output_file.pathname_.field_2._8_8_ = 0;
  this_00 = (FilePath *)((long)&output_dir.pathname_.field_2 + 8);
  FilePath::FilePath(this_00,&this->output_file_);
  FilePath::RemoveFileName((FilePath *)local_68,this_00);
  bVar1 = FilePath::CreateDirectoriesRecursively((FilePath *)local_68);
  if (bVar1) {
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&this->output_file_);
    output_file.pathname_.field_2._8_8_ = posix::FOpen(pcVar2,"w");
  }
  __stream = _stderr;
  if (output_file.pathname_.field_2._8_8_ != 0) {
    std::__cxx11::stringstream::stringstream(local_200);
    local_258 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x200) {
      local_258 = aoStack_1f0;
    }
    PrintXmlUnitTest(local_258,unit_test);
    StringStreamToString(&local_220,(stringstream *)local_200);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_220);
    fprintf((FILE *)output_file.pathname_.field_2._8_8_,"%s",pcVar2);
    std::__cxx11::string::~string((string *)&local_220);
    fclose((FILE *)output_file.pathname_.field_2._8_8_);
    std::__cxx11::stringstream::~stringstream(local_200);
    FilePath::~FilePath((FilePath *)local_68);
    FilePath::~FilePath((FilePath *)((long)&output_dir.pathname_.field_2 + 8));
    return;
  }
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&this->output_file_);
  fprintf(__stream,"Unable to open file \"%s\"\n",pcVar2);
  fflush(_stderr);
  exit(1);
}

Assistant:

void XmlUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* xmlout = NULL;
  FilePath output_file(output_file_);
  FilePath output_dir(output_file.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    xmlout = posix::FOpen(output_file_.c_str(), "w");
  }
  if (xmlout == NULL) {
    // TODO(wan): report the reason of the failure.
    //
    // We don't do it for now as:
    //
    //   1. There is no urgent need for it.
    //   2. It's a bit involved to make the errno variable thread-safe on
    //      all three operating systems (Linux, Windows, and Mac OS).
    //   3. To interpret the meaning of errno in a thread-safe way,
    //      we need the strerror_r() function, which is not available on
    //      Windows.
    fprintf(stderr,
            "Unable to open file \"%s\"\n",
            output_file_.c_str());
    fflush(stderr);
    exit(EXIT_FAILURE);
  }
  std::stringstream stream;
  PrintXmlUnitTest(&stream, unit_test);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}